

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O0

string * iutest::PrintToString<char[90]>(string *__return_storage_ptr__,char (*v) [90])

{
  iu_ostream *local_1b8;
  undefined1 local_1a0 [8];
  iu_global_format_stringstream strm;
  char (*v_local) [90];
  
  strm.super_iu_stringstream._384_8_ = v;
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a0);
  local_1b8 = (iu_ostream *)0x0;
  if (&stack0x00000000 != (undefined1 *)0x1a0) {
    local_1b8 = (iu_ostream *)&strm.super_iu_stringstream.field_0x8;
  }
  detail::UniversalTersePrint((char *)strm.super_iu_stringstream._384_8_,local_1b8);
  std::__cxx11::stringstream::str();
  iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string PrintToString(const T& v)
{
    iu_global_format_stringstream strm;
    detail::UniversalTersePrint(v, &strm);
    return strm.str();
}